

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_string_createWithSuffix(sysbvm_context_t *context,sysbvm_tuple_t string,char *suffix)

{
  size_t __n;
  size_t __n_00;
  _Bool *__dest;
  uint8_t *resultData;
  sysbvm_tuple_t result;
  size_t stringSize;
  size_t suffixLen;
  char *suffix_local;
  sysbvm_tuple_t string_local;
  sysbvm_context_t *context_local;
  
  __n = strlen(suffix);
  context_local = (sysbvm_context_t *)string;
  if (__n != 0) {
    __n_00 = sysbvm_tuple_getSizeInBytes(string);
    context_local = (sysbvm_context_t *)sysbvm_string_createEmptyWithSize(context,__n_00 + __n);
    __dest = &(context_local->heap).shouldAttemptToCollect;
    memcpy(__dest,(void *)(string + 0x10),__n_00);
    memcpy(__dest + __n_00,suffix,__n);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_string_createWithSuffix(sysbvm_context_t *context, sysbvm_tuple_t string, const char *suffix)
{
    size_t suffixLen = strlen(suffix);
    if(suffixLen == 0)
        return string;

    size_t stringSize = sysbvm_tuple_getSizeInBytes(string);
    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, stringSize + suffixLen);
    uint8_t *resultData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;
    memcpy(resultData, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, stringSize);
    memcpy(resultData + stringSize, suffix, suffixLen);
    return result;
}